

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O2

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
dealloc_remote_slow<snmalloc::CheckInitPthread>
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          PagemapEntry *entry,Alloc<void> p)

{
  ushort uVar1;
  ulong uVar2;
  CapPtr<snmalloc::BatchedRemoteMessage,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  CVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  unsigned_long *puVar8;
  Array<uint16_t,_false___2_:_(true___1_:_0)> *pAVar9;
  ushort uVar10;
  ulong uVar11;
  long *in_FS_OFFSET;
  bool bVar12;
  
  if ((Alloc *)*in_FS_OFFSET == &ThreadAlloc::default_alloc) {
    ThreadAlloc::CheckInitBase<snmalloc::CheckInitPthread>::
    check_init_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::dealloc_remote_slow<snmalloc::CheckInitPthread>(snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>const&,snmalloc::CapPtr<void,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>>)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,void*)_1_,void*>
              (p.unsafe_capptr);
    return;
  }
  uVar2 = (entry->
          super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
          ).super_MetaEntryBase.meta;
  uVar11 = uVar2 & 0xfffffffffffffffe;
  if (p.unsafe_capptr != (void *)0x0) {
    *(undefined8 *)p.unsafe_capptr = 0;
  }
  uVar2 = (ulong)(((uint)(uVar2 >> 3) & 0x1fffffff) * 0x3352d >> 0x10 & 7);
  if (uVar11 != (this->remote_dealloc_cache).batching.open_meta._M_elems[uVar2]) {
    if (uVar11 != *(ulong *)((long)this->alloc_classes + uVar2 * 8 + -0x80)) {
      pAVar9 = &(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar2].length;
      uVar10 = 0;
      uVar5 = uVar2;
      uVar6 = uVar2;
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        if (*(long *)((long)(this->remote_dealloc_cache).batching.open_meta._M_elems +
                     lVar7 + uVar2 * 8) == 0) {
          puVar8 = (unsigned_long *)
                   ((long)(this->remote_dealloc_cache).batching.open_meta._M_elems +
                   lVar7 + uVar2 * 8);
          uVar6 = uVar5;
          goto LAB_0010804f;
        }
        uVar1 = pAVar9->_M_elems[0];
        bVar12 = uVar10 < uVar1;
        if (uVar10 <= uVar1) {
          uVar10 = uVar1;
        }
        if (bVar12) {
          uVar6 = uVar5;
        }
        uVar5 = uVar5 + 1;
        pAVar9 = pAVar9 + 0xc;
      }
      puVar8 = (this->remote_dealloc_cache).batching.open_meta._M_elems + uVar6;
      if (*puVar8 != 0) {
        CVar3 = BatchedRemoteMessage::mk_from_freelist_builder
                          ((this->remote_dealloc_cache).batching.open_builder._M_elems + uVar6,
                           &freelist::Object::key_root,*puVar8 >> 3);
        uVar4 = *(uint *)((long)&((BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                   ::concretePagemap.body)->
                                 super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                                 ).super_MetaEntryBase.remote_and_sizeclass +
                         ((ulong)CVar3.unsafe_capptr >> 10 & 0xfffffffffffffff0)) >> 0xe & 0xff;
        *(this->remote_dealloc_cache).list._M_elems[uVar4].end._M_elems[0] =
             &(CVar3.unsafe_capptr)->message_link;
        (this->remote_dealloc_cache).list._M_elems[uVar4].end._M_elems[0] =
             (void **)&(CVar3.unsafe_capptr)->message_link;
        *puVar8 = 0;
      }
LAB_0010804f:
      *puVar8 = uVar11;
      (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar6].head._M_elems[0] =
           p.unsafe_capptr;
      (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar6].end._M_elems[0] =
           (void **)p.unsafe_capptr;
      (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar6].length._M_elems[0] = 1;
      goto LAB_00108067;
    }
    uVar2 = uVar2 + 1;
  }
  *(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar2].end._M_elems[0] =
       p.unsafe_capptr;
  (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar2].end._M_elems[0] =
       (void **)p.unsafe_capptr;
  pAVar9 = &(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar2].length;
  pAVar9->_M_elems[0] = pAVar9->_M_elems[0] + 1;
LAB_00108067:
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
  post<9216ul>((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                *)&this->remote_dealloc_cache,&this->backend_state,(alloc_id_t)&this->remote_alloc);
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void
    dealloc_remote_slow(const PagemapEntry& entry, capptr::Alloc<void> p)
    {
      CheckInit::check_init(
        [this, &entry, p]() SNMALLOC_FAST_PATH_LAMBDA {
#ifdef SNMALLOC_TRACING
          message<1024>(
            "Remote dealloc post {} ({}, {})",
            p.unsafe_ptr(),
            sizeclass_full_to_size(entry.get_sizeclass()),
            address_cast(entry.get_slab_metadata()));
#endif
          remote_dealloc_cache.template dealloc<sizeof(Allocator)>(
            entry.get_slab_metadata(), p, &entropy);

          post();
        },
        [](Allocator* a, void* p) {
          // Recheck what kind of dealloc we should do in case the allocator
          // we get from lazy_init is the originating allocator.
          a->dealloc(p); // TODO don't double count statistics
        },
        p.unsafe_ptr());
    }